

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O1

double rapidjson::internal::FastPath(double significand,int exp)

{
  RapidJSONException *this;
  double dVar1;
  
  dVar1 = 0.0;
  if (-0x135 < exp) {
    if (exp < 0) {
      if (0x134 < (uint)-exp) {
        this = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this,"rapidjson internal assertion failure: n >= 0 && n <= 308");
        goto LAB_00156793;
      }
      dVar1 = significand / *(double *)(Pow10(int)::e + (ulong)(uint)-exp * 8);
    }
    else {
      if (0x134 < (uint)exp) {
        this = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this,"rapidjson internal assertion failure: n >= 0 && n <= 308");
LAB_00156793:
        __cxa_throw(this,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar1 = significand * *(double *)(Pow10(int)::e + (ulong)(uint)exp * 8);
    }
  }
  return dVar1;
}

Assistant:

inline double FastPath(double significand, int exp) {
    if (exp < -308)
        return 0.0;
    else if (exp >= 0)
        return significand * internal::Pow10(exp);
    else
        return significand / internal::Pow10(-exp);
}